

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O3

int do_late_binding(int argc,char **argv)

{
  byte bVar1;
  size_t sVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  byte bVar7;
  char *pcVar8;
  char *__format;
  char **ppcVar9;
  int argc_1;
  char *p_path;
  long in_FS_OFFSET;
  size_t payload_size;
  char *device_path_found;
  igsc_device_handle handle;
  uint8_t payload [4096];
  undefined4 local_106c;
  long local_1060;
  uint32_t local_1054;
  size_t local_1050;
  char *local_1048;
  undefined8 local_1040;
  uint8_t local_1038 [4096];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 1) {
    uVar5 = 0xffffffff;
    if (quiet == '\0') {
      do_late_binding_cold_7();
    }
    goto LAB_00109ae7;
  }
  ppcVar9 = argv + 1;
  pcVar8 = (char *)0x0;
  p_path = (char *)0x0;
  local_1060 = 0;
  bVar7 = 0;
  local_106c = 0;
  bVar1 = 0;
  do {
    pcVar6 = ppcVar9[-1];
    _Var3 = arg_is_device(pcVar6);
    if (_Var3) {
      if (argc == 1) {
        uVar5 = 0xffffffff;
        if (quiet == '\0') {
          do_late_binding_cold_6();
        }
        goto LAB_00109ae7;
      }
      pcVar8 = *ppcVar9;
    }
    else {
      _Var3 = arg_is_token(pcVar6,"-p");
      if ((_Var3) || (_Var3 = arg_is_token(pcVar6,"--payload"), _Var3)) {
        if (argc == 1) {
          uVar5 = 0xffffffff;
          if (quiet == '\0') {
            do_late_binding_cold_3();
          }
          goto LAB_00109ae7;
        }
        p_path = *ppcVar9;
      }
      else {
        _Var3 = arg_is_token(pcVar6,"-f");
        if ((_Var3) || (_Var3 = arg_is_token(pcVar6,"--flags"), _Var3)) {
          if (argc == 1) {
            uVar5 = 0xffffffff;
            if (quiet == '\0') {
              do_late_binding_cold_2();
            }
            goto LAB_00109ae7;
          }
          local_1060 = strtol(*ppcVar9,(char **)0x0,0x10);
          bVar7 = 1;
        }
        else {
          _Var3 = arg_is_token(pcVar6,"-t");
          if ((!_Var3) && (_Var3 = arg_is_token(pcVar6,"--type"), !_Var3)) {
            uVar5 = 0xffffffff;
            if (quiet == '\0') {
              pcVar8 = "Error: Wrong argument %s\n";
LAB_00109b45:
              uVar5 = 0xffffffff;
              fprintf(_stderr,pcVar8,pcVar6);
            }
            goto LAB_00109ae7;
          }
          if (argc == 1) {
            uVar5 = 0xffffffff;
            if (quiet == '\0') {
              do_late_binding_cold_1();
            }
            goto LAB_00109ae7;
          }
          pcVar6 = *ppcVar9;
          _Var3 = arg_is_token(pcVar6,"vr-config");
          bVar1 = 1;
          local_106c = 2;
          if (!_Var3) {
            _Var3 = arg_is_token(pcVar6,"fan-table");
            local_106c = 1;
            if (!_Var3) {
              uVar5 = 0xffffffff;
              if (quiet == '\0') {
                pcVar8 = "Error: Bad payload type argument %s\n";
                goto LAB_00109b45;
              }
              goto LAB_00109ae7;
            }
          }
        }
      }
    }
    ppcVar9 = ppcVar9 + 2;
    argc = argc + -2;
  } while (argc != 0);
  if (!(bool)(bVar7 & bVar1 & p_path != (char *)0x0)) {
    uVar5 = 0xffffffff;
    if (quiet == '\0') {
      do_late_binding_cold_4();
    }
    goto LAB_00109ae7;
  }
  local_1048 = (char *)0x0;
  local_1050 = 0;
  local_1040 = 0;
  if ((pcVar8 == (char *)0x0) &&
     (iVar4 = get_first_device(&local_1048), pcVar8 = local_1048,
     local_1048 == (char *)0x0 || iVar4 != 0)) {
    uVar5 = 1;
    if (quiet == '\0') {
      do_late_binding_cold_5();
    }
    goto LAB_00109ae7;
  }
  pcVar6 = local_1048;
  iVar4 = read_from_file_to_buf(p_path,local_1038,0x1000,&local_1050);
  if (iVar4 == 0) {
    uVar5 = igsc_device_init_by_device(&local_1040,pcVar8);
    sVar2 = local_1050;
    if (uVar5 == 0) {
      iVar4 = 3;
      do {
        uVar5 = igsc_device_update_late_binding_config
                          (&local_1040,local_106c,local_1060,local_1038,sVar2,&local_1054);
        if (uVar5 != 0xd) {
          if (uVar5 == 0) {
            parse_late_binding_status(local_1054);
            uVar5 = 0;
            goto LAB_00109ad5;
          }
          break;
        }
        usleep(2000000);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      if (quiet == '\0') {
        fprintf(_stderr,"Error: Failed to send late binding command: %d\n",(ulong)uVar5);
      }
    }
    else if (quiet == '\0') {
      __format = "Error: Cannot initialize device: %s\n";
      goto LAB_00109a50;
    }
  }
  else {
    uVar5 = 1;
    if (quiet == '\0') {
      __format = "Error: Failed to read file : %s\n";
      pcVar8 = p_path;
      uVar5 = 1;
LAB_00109a50:
      fprintf(_stderr,__format,pcVar8);
    }
  }
LAB_00109ad5:
  igsc_device_close(&local_1040);
  free(pcVar6);
LAB_00109ae7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar5;
}

Assistant:

static int do_late_binding(int argc, char *argv[])
{
    const char *device_path = NULL;
    const char *payload_path = NULL;
    uint32_t flags = 0;
    bool flags_set = false;
    uint32_t type = 0;
    bool type_set = false;

    if (argc <= 0)
    {
        fwupd_error("No arguments provided\n");
        return ERROR_BAD_ARGUMENT;
    }

    do
    {
        if (arg_is_device(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No device to send the command to\n");
                return ERROR_BAD_ARGUMENT;
            }
            device_path = argv[0];
        }
        else if (arg_is_payload(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No payload file to send\n");
                return ERROR_BAD_ARGUMENT;
            }
            payload_path = argv[0];
        }
        else if (arg_is_flags(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No flags argument provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            flags = (uint32_t)strtol(argv[0], NULL, 16);
            flags_set = true;
        }
        else if (arg_is_type(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No payload type argument provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (arg_is_vr_config(argv[0]))
            {
                type = CSC_LATE_BINDING_TYPE_VR_CONFIG;
            }
            else if (arg_is_fan_table(argv[0]))
            {
                type = CSC_LATE_BINDING_TYPE_FAN_TABLE;
            }
            else
            {
                fwupd_error("Bad payload type argument %s\n", argv[0]);
                return ERROR_BAD_ARGUMENT;
            }
            type_set = true;
        }
        else
        {
            fwupd_error("Wrong argument %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    } while(arg_next(&argc, &argv));

    if (payload_path && flags_set && type_set)
    {
        return late_binding(device_path, payload_path, type, flags);
    }

    fwupd_error("No payload file or payload type or flags provided\n");
    return ERROR_BAD_ARGUMENT;
}